

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

unsigned_long
libssh2_channel_window_read_ex
          (LIBSSH2_CHANNEL *channel,unsigned_long *read_avail,unsigned_long *window_size_initial)

{
  uint32_t uVar1;
  list_node *plVar2;
  unsigned_long uVar3;
  list_node *node;
  
  if (channel != (LIBSSH2_CHANNEL *)0x0) {
    if (window_size_initial != (unsigned_long *)0x0) {
      *window_size_initial = (ulong)(channel->remote).window_size_initial;
    }
    if (read_avail != (unsigned_long *)0x0) {
      plVar2 = (list_node *)_libssh2_list_first(&channel->session->packets);
      uVar3 = 0;
      while (node = plVar2, node != (list_node *)0x0) {
        plVar2 = (list_node *)_libssh2_list_next(node);
        if (((node[1].prev != (list_node *)0x0) && ((list_node *)0x4 < node[1].prev)) &&
           (((ulong)(node[1].next)->next & 0xfe) == 0x5e)) {
          uVar1 = _libssh2_ntohu32((uchar *)((long)&(node[1].next)->next + 1));
          if (uVar1 == (channel->local).id) {
            uVar3 = (long)node[1].prev + (uVar3 - (long)node[1].head);
          }
        }
      }
      *read_avail = uVar3;
    }
    return (ulong)(channel->remote).window_size;
  }
  return 0;
}

Assistant:

LIBSSH2_API unsigned long
libssh2_channel_window_read_ex(LIBSSH2_CHANNEL *channel,
        /* FIXME: -> size_t */ unsigned long *read_avail,
                               unsigned long *window_size_initial)
{
    if(!channel)
        return 0; /* no channel, no window! */

    if(window_size_initial) {
        *window_size_initial = channel->remote.window_size_initial;
    }

    if(read_avail) {
        size_t bytes_queued = 0;
        LIBSSH2_PACKET *next_packet;
        LIBSSH2_PACKET *packet =
            _libssh2_list_first(&channel->session->packets);

        while(packet) {
            unsigned char packet_type;
               next_packet = _libssh2_list_next(&packet->node);

            if(packet->data_len < 1) {
                packet = next_packet;
                _libssh2_debug((channel->session, LIBSSH2_TRACE_ERROR,
                               "Unexpected packet length"));
                continue;
            }

            packet_type = packet->data[0];

            if(((packet_type == SSH_MSG_CHANNEL_DATA)
                || (packet_type == SSH_MSG_CHANNEL_EXTENDED_DATA))
               && ((packet->data_len >= 5)
                   && (_libssh2_ntohu32(packet->data + 1) ==
                       channel->local.id))) {
                bytes_queued += packet->data_len - packet->data_head;
            }

            packet = next_packet;
        }

        *read_avail = (unsigned long)bytes_queued;
    }

    return channel->remote.window_size;
}